

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_picard_bnd.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  N_Vector u;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  void *kmem;
  SUNContext sunctx;
  sunrealtype fnorm;
  void *local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  local_40 = (void *)0x0;
  puts("\n2D elliptic PDE on unit square");
  puts("   d^2 u / dx^2 + d^2 u / dy^2 = u^3 - u + 2.0");
  puts(" + homogeneous Dirichlet boundary conditions\n");
  puts("Solution method: Anderson accelerated Picard iteration with band linear solver.");
  printf("Problem size: %2ld x %2ld = %4ld\n",0x1f,0x1f,0x3c1);
  uVar1 = SUNContext_Create(0,&local_38);
  if ((int)uVar1 < 0) {
    pcVar6 = "SUNContext_Create";
  }
  else {
    u = (N_Vector)N_VNew_Serial(0x3c1,local_38);
    if (u == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    lVar2 = N_VNew_Serial(0x3c1,local_38);
    if (lVar2 == 0) {
      main_cold_4();
      return 1;
    }
    local_40 = (void *)KINCreate(local_38);
    if (local_40 == (void *)0x0) {
      main_cold_3();
      return 1;
    }
    uVar1 = KINSetMAA(local_40,3);
    if ((int)uVar1 < 0) {
      pcVar6 = "KINSetMAA";
    }
    else {
      uVar1 = KINInit(local_40,func,u);
      if ((int)uVar1 < 0) {
        pcVar6 = "KINInit";
      }
      else {
        uVar1 = KINSetFuncNormTol(0x3d719799812dea11,local_40);
        if ((int)uVar1 < 0) {
          pcVar6 = "KINSetFuncNormTol";
        }
        else {
          lVar3 = SUNBandMatrix(0x3c1,0x1f,0x1f,local_38);
          if (lVar3 == 0) {
            main_cold_2();
            return 1;
          }
          lVar4 = SUNLinSol_Band(u,lVar3,local_38);
          if (lVar4 == 0) {
            main_cold_1();
            return 1;
          }
          uVar1 = KINSetLinearSolver(local_40,lVar4,lVar3);
          if ((int)uVar1 < 0) {
            pcVar6 = "KINSetLinearSolver";
          }
          else {
            uVar1 = KINSetJacFn(local_40,jac);
            if ((int)uVar1 < 0) {
              pcVar6 = "KINSetJacFn";
            }
            else {
              N_VConst(0,u);
              lVar5 = N_VGetArrayPointer(u);
              *(undefined8 *)(lVar5 + 0x100) = 0x3ff0000000000000;
              N_VConst(0x3ff0000000000000,lVar2);
              uVar1 = KINSol(local_40,u,2,lVar2,lVar2);
              if ((int)uVar1 < 0) {
                pcVar6 = "KINSol";
              }
              else {
                uVar1 = KINGetFuncNorm(local_40,&local_30);
                if (-1 < (int)uVar1) {
                  printf("\nComputed solution (||F|| = %g):\n\n",local_30);
                  PrintOutput(u);
                  PrintFinalStats(local_40);
                  N_VDestroy(u);
                  N_VDestroy(lVar2);
                  KINFree(&local_40);
                  SUNLinSolFree(lVar4);
                  SUNMatDestroy(lVar3);
                  SUNContext_Free(&local_38);
                  return 0;
                }
                pcVar6 = "KINGetfuncNorm";
              }
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar6,(ulong)uVar1);
  return 1;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype fnormtol, fnorm;
  N_Vector y, scale;
  int retval;
  void* kmem;
  SUNMatrix J;
  SUNLinearSolver LS;

  y = scale = NULL;
  kmem      = NULL;
  J         = NULL;
  LS        = NULL;

  /* -------------------------
   * Print problem description
   * ------------------------- */

  printf("\n2D elliptic PDE on unit square\n");
  printf("   d^2 u / dx^2 + d^2 u / dy^2 = u^3 - u + 2.0\n");
  printf(" + homogeneous Dirichlet boundary conditions\n\n");
  printf("Solution method: Anderson accelerated Picard iteration with band "
         "linear solver.\n");
  printf("Problem size: %2ld x %2ld = %4ld\n", (long int)NX, (long int)NY,
         (long int)NEQ);

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* --------------------------------------
   * Create vectors for solution and scales
   * -------------------------------------- */

  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  scale = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)scale, "N_VNew_Serial", 0)) { return (1); }

  /* ----------------------------------------------------------------------------------
   * Initialize and allocate memory for KINSOL, set parametrs for Anderson acceleration
   * ---------------------------------------------------------------------------------- */

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  /* y is used as a template */

  /* Use acceleration with up to 3 prior residuals */
  retval = KINSetMAA(kmem, 3);
  if (check_retval(&retval, "KINSetMAA", 1)) { return (1); }

  retval = KINInit(kmem, func, y);
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* -------------------
   * Set optional inputs
   * ------------------- */

  /* Specify stopping tolerance based on residual */

  fnormtol = FTOL;
  retval   = KINSetFuncNormTol(kmem, fnormtol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }

  /* -------------------------
   * Create band SUNMatrix
   * ------------------------- */

  J = SUNBandMatrix(NEQ, NX, NX, sunctx);
  if (check_retval((void*)J, "SUNBandMatrix", 0)) { return (1); }

  /* ---------------------------
   * Create band SUNLinearSolver
   * --------------------------- */

  LS = SUNLinSol_Band(y, J, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return (1); }

  /* -------------------------
   * Attach band linear solver
   * ------------------------- */

  retval = KINSetLinearSolver(kmem, LS, J);
  if (check_retval(&retval, "KINSetLinearSolver", 1)) { return (1); }

  /* -------------------------
   * Set Jacobian function
   * ------------------------- */

  retval = KINSetJacFn(kmem, jac);
  if (check_retval(&retval, "KINSetJacFn", 1)) { return (1); }

  /* -------------
   * Initial guess
   * ------------- */

  N_VConst(ZERO, y);
  IJth(N_VGetArrayPointer(y), 2, 2) = ONE;

  /* ----------------------------
   * Call KINSol to solve problem
   * ---------------------------- */

  /* No scaling used */
  N_VConst(ONE, scale);

  /* Call main solver */
  retval = KINSol(kmem,       /* KINSol memory block */
                  y,          /* initial guess on input; solution vector */
                  KIN_PICARD, /* global strategy choice */
                  scale,      /* scaling vector, for the variable cc */
                  scale);     /* scaling vector for function values fval */
  if (check_retval(&retval, "KINSol", 1)) { return (1); }

  /* ------------------------------------
   * Print solution and solver statistics
   * ------------------------------------ */

  /* Get scaled norm of the system function */

  retval = KINGetFuncNorm(kmem, &fnorm);
  if (check_retval(&retval, "KINGetfuncNorm", 1)) { return (1); }

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("\nComputed solution (||F|| = %Lg):\n\n", fnorm);
#else
  printf("\nComputed solution (||F|| = %g):\n\n", fnorm);
#endif
  PrintOutput(y);

  PrintFinalStats(kmem);

  /* -----------
   * Free memory
   * ----------- */

  N_VDestroy(y);
  N_VDestroy(scale);
  KINFree(&kmem);
  SUNLinSolFree(LS);
  SUNMatDestroy(J);
  SUNContext_Free(&sunctx);

  return (0);
}